

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O1

void __thiscall glu::StructType::addMember(StructType *this,char *name,VarType *type)

{
  StructMember local_48;
  
  StructMember::StructMember(&local_48,name,type);
  std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>::
  emplace_back<glu::StructMember>(&this->m_members,&local_48);
  VarType::~VarType(&local_48.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_name._M_dataplus._M_p != &local_48.m_name.field_2) {
    operator_delete(local_48.m_name._M_dataplus._M_p,
                    local_48.m_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void StructType::addMember (const char* name, const VarType& type)
{
	m_members.push_back(StructMember(name, type));
}